

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O1

mmio_file_t * mmio_file_read(char *filename)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  mmio_file_t *pmVar3;
  ulong uVar4;
  char *fmt;
  long ln;
  stat buf;
  stat local_b0;
  
  __fd = open(filename,0);
  if (__fd == -1) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                   ,0xd9,"Failed to open %s",filename);
  }
  else {
    iVar1 = fstat(__fd,&local_b0);
    if (iVar1 == -1) {
      fmt = "Failed to stat %s";
      ln = 0xdd;
      local_b0.st_size = (__off_t)filename;
    }
    else {
      pvVar2 = mmap((void *)0x0,local_b0.st_size,1,1,__fd,0);
      if (pvVar2 != (void *)0xffffffffffffffff) {
        close(__fd);
        pmVar3 = (mmio_file_t *)
                 __ckd_calloc__(1,0x10,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                                ,0xe8);
        pmVar3->ptr = pvVar2;
        uVar4 = sysconf(0x1e);
        pmVar3->mapsize =
             (long)(local_b0.st_size + (uVar4 - 1)) - (local_b0.st_size + (uVar4 - 1)) % uVar4;
        return pmVar3;
      }
      fmt = "Failed to mmap %lld bytes";
      ln = 0xe3;
    }
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/mmio.c"
                   ,ln,fmt,local_b0.st_size);
    close(__fd);
  }
  return (mmio_file_t *)0x0;
}

Assistant:

mmio_file_t *
mmio_file_read(const char *filename)
{
    mmio_file_t *mf;
    struct stat buf;
    void *ptr;
    int fd;
    size_t pagesize;

    if ((fd = open(filename, O_RDONLY)) == -1) {
        E_ERROR_SYSTEM("Failed to open %s", filename);
        return NULL;
    }
    if (fstat(fd, &buf) == -1) {
        E_ERROR_SYSTEM("Failed to stat %s", filename);
        close(fd);
        return NULL;
    }
    ptr = mmap(NULL, buf.st_size, PROT_READ, MAP_SHARED, fd, 0);
    if (ptr == (void *)-1) {
        E_ERROR_SYSTEM("Failed to mmap %lld bytes", (unsigned long long)buf.st_size);
        close(fd);
        return NULL;
    }
    close(fd);
    mf = ckd_calloc(1, sizeof(*mf));
    mf->ptr = ptr;
    /* Align map size to next page. */
    pagesize = sysconf(_SC_PAGESIZE);
    mf->mapsize = (buf.st_size + pagesize - 1) / pagesize * pagesize;

    return mf;
}